

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void __thiscall HighFreqSub::HighFreqSub(HighFreqSub *this,HighFreqDataType *hf,SubType type)

{
  HighFreqDataType local_b0;
  
  this->_vptr_HighFreqSub = (_func_int **)&PTR__HighFreqSub_003eb960;
  HighFreqDataType::HighFreqDataType(&this->dt);
  this->actor = (zactor_t *)0x0;
  this->sub = (zsock_t *)0x0;
  this->sockType = type;
  HighFreqDataType::HighFreqDataType(&local_b0,hf);
  registerDataType(this,&local_b0);
  HighFreqDataType::~HighFreqDataType(&local_b0);
  return;
}

Assistant:

HighFreqSub::HighFreqSub(HighFreqDataType hf, SubType type)
    : actor(NULL),
      sub(NULL),
//      registered(false),
      sockType(type)
{
    registerDataType(hf);
}